

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFRAgent.cpp
# Opt level: O2

void __thiscall
Agent::CFRAgent<Kuhn::Game>::CFRAgent(CFRAgent<Kuhn::Game> *this,mt19937 *engine,string *path)

{
  binary_iarchive ia;
  ifstream ifs;
  
  this->mEngine = engine;
  (this->mStrategy)._M_h._M_buckets = &(this->mStrategy)._M_h._M_single_bucket;
  (this->mStrategy)._M_h._M_bucket_count = 1;
  (this->mStrategy)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mStrategy)._M_h._M_element_count = 0;
  (this->mStrategy)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mStrategy)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mStrategy)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::ifstream::ifstream(&ifs,(string *)path,_S_in);
  boost::archive::binary_iarchive::binary_iarchive(&ia,(istream *)&ifs,0);
  boost::archive::detail::load_non_pointer_type<boost::archive::binary_iarchive>::load_standard::
  invoke<std::unordered_map<std::__cxx11::string,Trainer::Node*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Trainer::Node*>>>>
            (&ia,&this->mStrategy);
  std::ifstream::close();
  boost::archive::
  binary_iarchive_impl<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>::
  ~binary_iarchive_impl
            (&ia.
              super_binary_iarchive_impl<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>
            );
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

CFRAgent<T>::CFRAgent(std::mt19937 &engine, const std::string &path) : mEngine(engine) {
    std::ifstream ifs(path);
    boost::archive::binary_iarchive ia(ifs);
    ia >> mStrategy;
    ifs.close();
}